

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void anon_unknown.dwarf_f6bf2::setClipboardText(void *param_1,char *text)

{
  size_t sVar1;
  char *in_RCX;
  String local_38;
  char *local_18;
  char *text_local;
  void *param_0_local;
  
  local_18 = text;
  text_local = (char *)param_1;
  sVar1 = strlen(text);
  sf::String::fromUtf8<char_const*>(&local_38,(String *)text,text + sVar1,in_RCX);
  sf::Clipboard::setString(&local_38);
  sf::String::~String(&local_38);
  return;
}

Assistant:

void setClipboardText(void* /*userData*/, const char* text) {
    sf::Clipboard::setString(sf::String::fromUtf8(text, text + std::strlen(text)));
}